

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O0

bool duckdb::DecimalCastOperation::HandleDigit<duckdb::DecimalCastData<long>,_false>
               (DecimalCastData<long> *state,uint8_t digit)

{
  long lVar1;
  long lVar2;
  byte in_SIL;
  long *in_RDI;
  bool local_1;
  
  if ((*in_RDI == 0) && (in_SIL == 0)) {
    local_1 = true;
  }
  else if ((uint)*(byte *)((long)in_RDI + 10) ==
           (uint)*(byte *)(in_RDI + 1) - (uint)*(byte *)((long)in_RDI + 9)) {
    local_1 = false;
  }
  else {
    *(char *)((long)in_RDI + 10) = *(char *)((long)in_RDI + 10) + '\x01';
    lVar1 = *in_RDI;
    lVar2 = NumericLimits<long>::Maximum();
    if (lVar2 / 10 < lVar1) {
      local_1 = false;
    }
    else {
      *in_RDI = *in_RDI * 10 + (ulong)in_SIL;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

static bool HandleDigit(T &state, uint8_t digit) {
		if (state.result == 0 && digit == 0) {
			// leading zero's don't count towards the digit count
			return true;
		}
		if (state.digit_count == state.width - state.scale) {
			// width of decimal type is exceeded!
			return false;
		}
		state.digit_count++;
		if (NEGATIVE) {
			if (state.result < (NumericLimits<typename T::StoreType>::Minimum() / 10)) {
				return false;
			}
			state.result = state.result * 10 - digit;
		} else {
			if (state.result > (NumericLimits<typename T::StoreType>::Maximum() / 10)) {
				return false;
			}
			state.result = state.result * 10 + digit;
		}
		return true;
	}